

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O3

void __thiscall
RTree::get_polygons_JSON(RTree *this,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *ans,string *json)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  string __str;
  long *local_68 [2];
  long local_58 [2];
  vector<Point,_std::allocator<Point>_> local_48;
  
  std::__cxx11::string::append((char *)json);
  if ((ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar8 = 0;
    do {
      std::__cxx11::string::append((char *)json);
      if (0 < (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8]->polygon->corners) {
        uVar7 = 0;
        do {
          std::__cxx11::string::append((char *)json);
          Polygon::get_vertices
                    (&local_48,
                     (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8]->polygon);
          uVar4 = local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].X;
          uVar1 = -uVar4;
          if (0 < (int)uVar4) {
            uVar1 = uVar4;
          }
          uVar6 = 1;
          if (9 < uVar1) {
            uVar5 = (ulong)uVar1;
            uVar2 = 4;
            do {
              uVar6 = uVar2;
              uVar3 = (uint)uVar5;
              if (uVar3 < 100) {
                uVar6 = uVar6 - 2;
                goto LAB_001071ef;
              }
              if (uVar3 < 1000) {
                uVar6 = uVar6 - 1;
                goto LAB_001071ef;
              }
              if (uVar3 < 10000) goto LAB_001071ef;
              uVar5 = uVar5 / 10000;
              uVar2 = uVar6 + 4;
            } while (99999 < uVar3);
            uVar6 = uVar6 + 1;
          }
LAB_001071ef:
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct
                    ((ulong)local_68,(char)uVar6 - (char)((int)uVar4 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_68[0]),uVar6,uVar1);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_68[0]);
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          if (local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          std::__cxx11::string::append((char *)json);
          Polygon::get_vertices
                    (&local_48,
                     (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8]->polygon);
          uVar4 = local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].Y;
          uVar1 = -uVar4;
          if (0 < (int)uVar4) {
            uVar1 = uVar4;
          }
          uVar6 = 1;
          if (9 < uVar1) {
            uVar5 = (ulong)uVar1;
            uVar2 = 4;
            do {
              uVar6 = uVar2;
              uVar3 = (uint)uVar5;
              if (uVar3 < 100) {
                uVar6 = uVar6 - 2;
                goto LAB_001072f6;
              }
              if (uVar3 < 1000) {
                uVar6 = uVar6 - 1;
                goto LAB_001072f6;
              }
              if (uVar3 < 10000) goto LAB_001072f6;
              uVar5 = uVar5 / 10000;
              uVar2 = uVar6 + 4;
            } while (99999 < uVar3);
            uVar6 = uVar6 + 1;
          }
LAB_001072f6:
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct
                    ((ulong)local_68,(char)uVar6 - (char)((int)uVar4 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_68[0]),uVar6,uVar1);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_68[0]);
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          if (local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          std::__cxx11::string::append((char *)json);
          uVar7 = uVar7 + 1;
          uVar4 = (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar8]->polygon->corners;
          if (uVar7 != uVar4) {
            std::__cxx11::string::append((char *)json);
            uVar4 = (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar8]->polygon->corners;
          }
        } while ((long)uVar7 < (long)(int)uVar4);
      }
      std::__cxx11::string::append((char *)json);
      uVar8 = uVar8 + 1;
      uVar7 = (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      if (uVar7 != uVar8) {
        std::__cxx11::string::append((char *)json);
        uVar7 = (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3;
      }
    } while (uVar8 < uVar7);
  }
  std::__cxx11::string::append((char *)json);
  return;
}

Assistant:

void RTree::get_polygons_JSON(const std::vector<d_leaf*> & ans,std::string &json){
    json += "[";
    for(int i=0; i<ans.size(); i++){
        json +="[";    
        for(int j = 0; j < ans[i]->polygon->corners;j++){
           json +="[";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_X());
           json += ",";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_Y()); 
           json +="]";
           if((j+1) != ans[i]->polygon->corners)
                json +=",";
        }
        json +="]";
        if((i+1) != ans.size())
            json +=",";
    }
    json += "]";
}